

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

string * __thiscall
helics::Federate::query_abi_cxx11_
          (Federate *this,string_view target,string_view queryStr,HelicsSequencingModes mode)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  element_type *peVar2;
  char *in_RCX;
  size_t in_RDX;
  Federate *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_stack_00000008;
  HelicsSequencingModes in_stack_00000054;
  Federate *in_stack_00000058;
  string_view in_stack_00000060;
  string *res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  pbVar3 = in_RDI;
  local_18._M_len = in_RDX;
  local_18._M_str = in_RCX;
  std::__cxx11::string::string(in_RDI);
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (!bVar1) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,in_stack_fffffffffffffee8)
    ;
    __x._M_len._4_4_ = in_stack_ffffffffffffff0c;
    __x._M_len._0_4_ = in_stack_ffffffffffffff08;
    __x._M_str._0_4_ = in_stack_ffffffffffffff10;
    __x._M_str._4_4_ = in_stack_ffffffffffffff14;
    __y._M_str = (char *)in_RSI;
    __y._M_len = (size_t)pbVar3;
    bVar1 = std::operator==(__x,__y);
    if (!bVar1) {
      getName_abi_cxx11_(in_RSI);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffee0);
      __x_00._M_len._4_4_ = in_stack_ffffffffffffff0c;
      __x_00._M_len._0_4_ = in_stack_ffffffffffffff08;
      __x_00._M_str._0_4_ = in_stack_ffffffffffffff10;
      __x_00._M_str._4_4_ = in_stack_ffffffffffffff14;
      __y_00._M_str = (char *)in_RSI;
      __y_00._M_len = (size_t)pbVar3;
      bVar1 = std::operator==(__x_00,__y_00);
      if (!bVar1) {
        peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3532b0);
        (*peVar2->_vptr_Core[0x5e])
                  (&stack0xffffffffffffff28,peVar2,local_18._M_len,local_18._M_str,in_R8,in_R9,
                   in_stack_00000008);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        std::__cxx11::string::~string(in_stack_fffffffffffffee0);
        return (string *)pbVar3;
      }
    }
  }
  query_abi_cxx11_(in_stack_00000058,in_stack_00000060,in_stack_00000054);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(in_stack_fffffffffffffee0);
  return (string *)pbVar3;
}

Assistant:

std::string
    Federate::query(std::string_view target, std::string_view queryStr, HelicsSequencingModes mode)
{
    std::string res;
    if ((target.empty()) || (target == "federate") || (target == getName())) {
        res = query(queryStr);
    } else {
        res = coreObject->query(target, queryStr, mode);
    }
    return res;
}